

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

void tb_flush_mipsel(CPUState *cpu)

{
  target_ulong (*patVar1) [3];
  int iVar2;
  uc_struct *uc;
  void **extraout_RDX;
  void **lp;
  void **extraout_RDX_00;
  long lVar3;
  uc_struct_conflict7 *puVar4;
  
  uc = (uc_struct *)cpu->uc;
  memset(cpu->tb_jmp_cache,0,0x8000);
  qht_reset_size(uc,(qht *)(uc->tcg_ctx->gen_insn_data + 0x180),0x8000);
  puVar4 = cpu->uc;
  iVar2 = puVar4->v_l1_size;
  if (0 < (long)iVar2) {
    lVar3 = 0;
    lp = extraout_RDX;
    do {
      page_flush_tb_1((uc_struct_conflict5 *)(ulong)(uint)puVar4->v_l2_levels,
                      (int)puVar4->l1_map + (int)lVar3,lp);
      lVar3 = lVar3 + 8;
      lp = extraout_RDX_00;
    } while ((long)iVar2 * 8 != lVar3);
    puVar4 = cpu->uc;
  }
  tcg_region_reset_all_mipsel((TCGContext_conflict4 *)puVar4->tcg_ctx);
  patVar1 = cpu->uc->tcg_ctx->gen_insn_data + 0x101;
  *(int *)*patVar1 = (int)(*patVar1)[0] + 1;
  return;
}

Assistant:

void tb_flush(CPUState *cpu)
{
    unsigned tb_flush_count = cpu->uc->tcg_ctx->tb_ctx.tb_flush_count;
    do_tb_flush(cpu, RUN_ON_CPU_HOST_INT(tb_flush_count));
}